

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

void __thiscall Automaton::buildNullables(Automaton *this)

{
  byte bVar1;
  Grammar *pGVar2;
  iterator iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::_List_iterator<QString>_>,_bool> pVar6;
  key_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pGVar2 = this->_M_grammar;
  do {
    p_Var5 = (pGVar2->rules).super__List_base<Rule,_std::allocator<Rule>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&pGVar2->rules) break;
    bVar1 = 0;
    do {
      for (p_Var4 = *(_List_node_base **)((long)(p_Var5 + 1) + 8);
          p_Var4 != (_List_node_base *)((long)(p_Var5 + 1) + 8U); p_Var4 = p_Var4->_M_next) {
        local_40._M_node = p_Var4[1]._M_next;
        iVar3 = std::
                _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                ::find(&(this->nullables)._M_t,&local_40);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->nullables)._M_t._M_impl.super__Rb_tree_header) {
          if (p_Var4 != (_List_node_base *)((long)(p_Var5 + 1) + 8U)) goto LAB_0010ba0a;
          break;
        }
      }
      pVar6 = std::
              _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
              ::_M_insert_unique<std::_List_iterator<QString>const&>
                        ((_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
                          *)&this->nullables,(_List_iterator<QString> *)(p_Var5 + 1));
      bVar1 = bVar1 | pVar6.second;
LAB_0010ba0a:
      p_Var5 = p_Var5->_M_next;
      pGVar2 = this->_M_grammar;
    } while (p_Var5 != (_List_node_base *)&pGVar2->rules);
  } while ((bVar1 & 1) != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::buildNullables ()
{
  bool changed = true;

  while (changed)
    {
      changed = false;

      for (RulePointer rule = _M_grammar->rules.begin (); rule != _M_grammar->rules.end (); ++rule)
        {
          NameList::iterator nn = std::find_if(rule->rhs.begin(), rule->rhs.end(), NotNullable(this));

          if (nn == rule->rhs.end ())
            changed |= nullables.insert (rule->lhs).second;
        }
    }

#ifndef QLALR_NO_DEBUG_NULLABLES
  qerr() << "nullables = {" << nullables << Qt::endl;
#endif
}